

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswCnf.c
# Opt level: O0

void Ssw_ObjAddToFrontier(Ssw_Sat_t *p,Aig_Obj_t *pObj,Vec_Ptr_t *vFrontier)

{
  int iVar1;
  Vec_Ptr_t *vFrontier_local;
  Aig_Obj_t *pObj_local;
  Ssw_Sat_t *p_local;
  
  iVar1 = Aig_IsComplement(pObj);
  if (iVar1 != 0) {
    __assert_fail("!Aig_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswCnf.c"
                  ,0x144,"void Ssw_ObjAddToFrontier(Ssw_Sat_t *, Aig_Obj_t *, Vec_Ptr_t *)");
  }
  iVar1 = Ssw_ObjSatNum(p,pObj);
  if (iVar1 == 0) {
    iVar1 = Ssw_ObjSatNum(p,pObj);
    if (iVar1 != 0) {
      __assert_fail("Ssw_ObjSatNum(p,pObj) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswCnf.c"
                    ,0x147,"void Ssw_ObjAddToFrontier(Ssw_Sat_t *, Aig_Obj_t *, Vec_Ptr_t *)");
    }
    iVar1 = Aig_ObjIsConst1(pObj);
    if (iVar1 == 0) {
      iVar1 = Aig_ObjIsCi(pObj);
      if (iVar1 != 0) {
        Vec_PtrPush(p->vUsedPis,pObj);
      }
      iVar1 = p->nSatVars;
      p->nSatVars = iVar1 + 1;
      Ssw_ObjSetSatNum(p,pObj,iVar1);
      sat_solver_setnvars(p->pSat,(p->nSatVars / 100 + 1) * 100);
      iVar1 = Aig_ObjIsNode(pObj);
      if (iVar1 != 0) {
        Vec_PtrPush(vFrontier,pObj);
      }
    }
  }
  return;
}

Assistant:

void Ssw_ObjAddToFrontier( Ssw_Sat_t * p, Aig_Obj_t * pObj, Vec_Ptr_t * vFrontier )
{
    assert( !Aig_IsComplement(pObj) );
    if ( Ssw_ObjSatNum(p,pObj) )
        return;
    assert( Ssw_ObjSatNum(p,pObj) == 0 );
    if ( Aig_ObjIsConst1(pObj) )
        return;
//    pObj->fMarkA = 1;
    // save PIs (used by register correspondence)
    if ( Aig_ObjIsCi(pObj) )
        Vec_PtrPush( p->vUsedPis, pObj );
    Ssw_ObjSetSatNum( p, pObj, p->nSatVars++ );
    sat_solver_setnvars( p->pSat, 100 * (1 + p->nSatVars / 100) );
    if ( Aig_ObjIsNode(pObj) )
        Vec_PtrPush( vFrontier, pObj );
}